

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twosidemix.hpp
# Opt level: O1

void __thiscall
TwoSideMix::TwoSideMix(TwoSideMix *this,Json *conf,BSDF *componentA,BSDF *componentB)

{
  const_reference o;
  undefined8 *puVar1;
  char *pcVar2;
  float fVar3;
  vec3f vVar4;
  
  BSDF::BSDF(&this->super_BSDF,conf);
  (this->super_BSDF)._vptr_BSDF = (_func_int **)&PTR_f_0016cc48;
  this->componentA = componentA;
  this->componentB = componentB;
  o = nlohmann::
      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
      ::operator[]<char_const>
                ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                  *)conf,"amount");
  vVar4 = json2vec3f(o);
  fVar3 = vVar4.x;
  if (fVar3 == vVar4.y) {
    if ((fVar3 == vVar4.z) && (!NAN(fVar3) && !NAN(vVar4.z))) {
      this->amount = fVar3;
      if ((componentA == (BSDF *)0x0) || (componentB == (BSDF *)0x0)) {
        puVar1 = (undefined8 *)__cxa_allocate_exception(8);
        pcVar2 = "mix: invalid components";
        goto LAB_0013c7ce;
      }
      if ((0.0 <= fVar3) && (fVar3 <= 1.0)) {
        return;
      }
    }
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  pcVar2 = "mix: invalid amount";
LAB_0013c7ce:
  *puVar1 = pcVar2;
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

TwoSideMix(const Json& conf, BSDF const* componentA, BSDF const* componentB):
		BSDF(conf), componentA(componentA), componentB(componentB)
	{
		vec3f vamount = json2vec3f(conf["amount"]);
		if (vamount.x != vamount.y || vamount.x != vamount.z) throw "mix: invalid amount";
		amount = vamount.x;
		if (componentA == NULL || componentB == NULL) throw "mix: invalid components";
		if (!(amount>=0 && amount<=1)) throw "mix: invalid amount";
	}